

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

Var Js::JavascriptNumber::EntryToPrecision(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  JavascriptString *pJVar10;
  Type TVar11;
  int in_stack_00000010;
  CallInfo local_70;
  undefined8 uStack_68;
  double local_60;
  double value;
  Var result;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (Var)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)result) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x2b5,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ceb88f;
    *puVar7 = 0;
  }
  callInfo_local = (CallInfo)result;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&result);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)result & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x2b8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00ceb88f;
    *puVar7 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) != 0) {
    pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    BVar4 = GetThisValue(pvVar8,&local_60);
    if (BVar4 != 0) {
      if (((ulong)callInfo_local & 0xfffffe) != 0) {
        pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        if (pvVar8 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00ceb88f;
          *puVar7 = 0;
        }
        if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00ceb88f;
          *puVar7 = 0;
        }
        if ((ulong)pvVar8 >> 0x32 == 0 && ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
          pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
          if (pRVar9 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar3) goto LAB_00ceb88f;
            *puVar7 = 0;
          }
          TVar11 = ((pRVar9->type).ptr)->typeId;
          if (0x57 < (int)TVar11) {
            BVar4 = RecyclableObject::IsExternal(pRVar9);
            if (BVar4 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar3) goto LAB_00ceb88f;
              *puVar7 = 0;
            }
            TVar11 = TypeIds_FirstNumberType;
          }
        }
        else {
          TVar11 = TypeIds_FirstNumberType;
        }
        if (TVar11 != TypeIds_Undefined) {
          pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,1);
          if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00ceb88f;
            *puVar7 = 0;
          }
          if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00ceb88f;
              *puVar7 = 0;
            }
          }
          else {
            uVar6 = JavascriptConversion::ToInt32_Full(pvVar8,pSVar1);
            pvVar8 = (Var)(ulong)uVar6;
          }
          pJVar10 = ToStringNanOrInfinite(local_60,pSVar1);
          if (pJVar10 != (JavascriptString *)0x0) {
            return pJVar10;
          }
          if (0xffffffea < (int)pvVar8 - 0x16U) {
            pvVar8 = FormatDoubleToString(local_60,FormatPrecision,(int)pvVar8,pSVar1);
            return pvVar8;
          }
          JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec5d,(PCWSTR)0x0);
        }
      }
      pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pJVar10 = JavascriptConversion::ToString(pvVar8,pSVar1);
      return pJVar10;
    }
    pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    if (pvVar8 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00ceb88f;
      *puVar7 = 0;
    }
    if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00ceb88f;
      *puVar7 = 0;
    }
    TVar11 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar11 = TypeIds_Number, (ulong)pvVar8 >> 0x32 == 0)) {
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
      if (pRVar9 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00ceb88f;
        *puVar7 = 0;
      }
      TVar11 = ((pRVar9->type).ptr)->typeId;
      if ((0x57 < (int)TVar11) && (BVar4 = RecyclableObject::IsExternal(pRVar9), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00ceb88f:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
    if (TVar11 == TypeIds_HostDispatch) {
      pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
      local_70._0_4_ = callInfo_local._0_4_;
      local_70._4_4_ = callInfo_local._4_4_;
      uStack_68 = &stack0x00000018;
      iVar5 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])(pRVar9,EntryToPrecision,&local_70,&value);
      if (iVar5 != 0) {
        return (Var)value;
      }
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3c,L"Number.prototype.toPrecision");
}

Assistant:

Var JavascriptNumber::EntryToPrecision(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toPrecision"));
        }
        AssertMsg(args.Info.Count > 0, "negative arg count");

        // spec implies ToPrec is not generic. 'this' must be a number
        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToPrecision, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toPrecision"));
        }
        if(args.Info.Count < 2 || JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
        {
            return JavascriptConversion::ToString(args[0], scriptContext);
        }

        int precision;
        Var aPrecision = args[1];
        if(TaggedInt::Is(aPrecision))
        {
            precision = TaggedInt::ToInt32(aPrecision);
        }
        else
        {
            precision = (int) JavascriptConversion::ToInt32(aPrecision, scriptContext);
        }

        JavascriptString * nanF;
        if (nullptr != (nanF = ToStringNanOrInfinite(value, scriptContext)))
        {
            return nanF;
        }

        if(precision < 1 || precision > 21)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_PrecisionOutOfRange);
        }
        return FormatDoubleToString(value, NumberUtilities::FormatPrecision, precision, scriptContext);
    }